

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

int mbedtls_gcm_update(mbedtls_gcm_context *ctx,size_t length,uchar *input,uchar *output)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_t olen;
  uchar ectr [16];
  
  olen = 0;
  iVar4 = -0x14;
  if ((output <= input || length <= (ulong)((long)output - (long)input)) &&
     (uVar7 = ctx->len + length, uVar7 < 0x3ffffe1 && !CARRY8(ctx->len,length))) {
    ctx->len = uVar7;
    for (; length != 0; length = length - uVar7) {
      uVar7 = 0x10;
      if (length < 0x10) {
        uVar7 = length;
      }
      lVar5 = 0x187;
      do {
        if (lVar5 - 0x177U < 0xd) break;
        puVar1 = (ctx->cipher_ctx).unprocessed_data + lVar5 + -0x20;
        *puVar1 = *puVar1 + '\x01';
        lVar5 = lVar5 + -1;
      } while (*puVar1 == '\0');
      iVar4 = mbedtls_cipher_update(&ctx->cipher_ctx,ctx->y,0x10,ectr,&olen);
      if (iVar4 != 0) {
        return iVar4;
      }
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        if (ctx->mode == 0) {
          ctx->buf[uVar6] = ctx->buf[uVar6] ^ input[uVar6];
        }
        bVar2 = input[uVar6];
        bVar3 = ectr[uVar6];
        output[uVar6] = bVar2 ^ bVar3;
        if (ctx->mode == 1) {
          ctx->buf[uVar6] = ctx->buf[uVar6] ^ bVar2 ^ bVar3;
        }
      }
      gcm_mult(ctx,ctx->buf,ctx->buf);
      input = input + uVar7;
      output = output + uVar7;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int mbedtls_gcm_update( mbedtls_gcm_context *ctx,
                size_t length,
                const unsigned char *input,
                unsigned char *output )
{
    int ret;
    unsigned char ectr[16];
    size_t i;
    const unsigned char *p;
    unsigned char *out_p = output;
    size_t use_len, olen = 0;

    if( output > input && (size_t) ( output - input ) < length )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    /* Total length is restricted to 2^39 - 256 bits, ie 2^36 - 2^5 bytes
     * Also check for possible overflow */
    if( ctx->len + length < ctx->len ||
        (uint64_t) ctx->len + length > 0x03FFFFE0ull )
    {
        return( MBEDTLS_ERR_GCM_BAD_INPUT );
    }

    ctx->len += length;

    p = input;
    while( length > 0 )
    {
        use_len = ( length < 16 ) ? length : 16;

        for( i = 16; i > 12; i-- )
            if( ++ctx->y[i - 1] != 0 )
                break;

        if( ( ret = mbedtls_cipher_update( &ctx->cipher_ctx, ctx->y, 16, ectr,
                                   &olen ) ) != 0 )
        {
            return( ret );
        }

        for( i = 0; i < use_len; i++ )
        {
            if( ctx->mode == MBEDTLS_GCM_DECRYPT )
                ctx->buf[i] ^= p[i];
            out_p[i] = ectr[i] ^ p[i];
            if( ctx->mode == MBEDTLS_GCM_ENCRYPT )
                ctx->buf[i] ^= out_p[i];
        }

        gcm_mult( ctx, ctx->buf, ctx->buf );

        length -= use_len;
        p += use_len;
        out_p += use_len;
    }

    return( 0 );
}